

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O1

void __thiscall
pbrt::DigitPermutation::DigitPermutation
          (DigitPermutation *this,int base,uint32_t seed,Allocator alloc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t w;
  long lVar9;
  float fVar10;
  int vb;
  int va;
  
  this->base = base;
  vb = 0x10000;
  va = base;
  if (base < 0x10000) {
    this->nDigits = 0;
    fVar10 = 1.0;
    iVar2 = 0;
    iVar6 = 0;
    do {
      fVar10 = (1.0 / (float)base) * fVar10;
      iVar6 = iVar6 + 1;
      iVar2 = iVar2 + base;
    } while (1.0 - fVar10 < 1.0);
    this->nDigits = iVar6;
    iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                      (alloc.memoryResource,(long)iVar2 * 2,2);
    this->permutations = (uint16_t *)CONCAT44(extraout_var,iVar6);
    iVar2 = this->nDigits;
    if (0 < (long)iVar2) {
      uVar5 = base - 1U >> 1 | base - 1U;
      uVar5 = uVar5 >> 2 | uVar5;
      uVar5 = uVar5 >> 4 | uVar5;
      uVar5 = uVar5 >> 8 | uVar5;
      uVar5 = uVar5 >> 0x10 | uVar5;
      iVar1 = this->base;
      lVar9 = 0;
      do {
        if (0 < base) {
          uVar7 = base * 0x20 + (int)lVar9 ^ seed;
          uVar8 = 0;
          do {
            uVar4 = uVar8 & 0xffffffff;
            do {
              uVar3 = ((uint)uVar4 ^ uVar7) * -0x1e8f76c3 ^ uVar7 >> 0x10;
              uVar3 = ((uVar3 & uVar5) >> 4 ^ uVar7 >> 8 ^ uVar3) * 0x929eb3f ^ uVar7 >> 0x17;
              uVar3 = ((uVar3 & uVar5) >> 1 ^ uVar3) * (uVar7 >> 0x1b | 1) * 0x6935fa69;
              uVar3 = ((uVar3 & uVar5) >> 0xb ^ uVar3) * 0x74dcb303;
              uVar3 = ((uVar3 & uVar5) >> 2 ^ uVar3) * -0x61afe33d;
              uVar3 = ((uVar3 & uVar5) >> 2 ^ uVar3) * -0x379f5c21 & uVar5;
              uVar3 = uVar3 >> 5 ^ uVar3;
              uVar4 = (ulong)uVar3;
            } while ((uint)base <= uVar3);
            ((uint16_t *)CONCAT44(extraout_var,iVar6))[lVar9 * iVar1 + uVar8] =
                 (uint16_t)((uVar3 + uVar7) % (uint)base);
            uVar8 = uVar8 + 1;
          } while (uVar8 != (uint)base);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar2);
    }
    return;
  }
  LogFatal<char_const(&)[5],char_const(&)[6],char_const(&)[5],int&,char_const(&)[6],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/lowdiscrepancy.h"
             ,0x1e,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [5])"base",
             (char (*) [6])"65536",(char (*) [5])"base",&va,(char (*) [6])"65536",&vb);
}

Assistant:

DigitPermutation(int base, uint32_t seed, Allocator alloc) : base(base) {
        CHECK_LT(base, 65536);  // uint16_t
        // Compute number of digits needed for _base_
        nDigits = 0;
        Float invBase = (Float)1 / (Float)base;
        Float invBaseN = 1;
        while (1 - invBaseN < 1) {
            ++nDigits;
            invBaseN *= invBase;
        }

        permutations = alloc.allocate_object<uint16_t>(nDigits * base);
        for (int digitIndex = 0; digitIndex < nDigits; ++digitIndex) {
            // Compute random permutation for _digitIndex_
            uint32_t digitSeed = (base * 32 + digitIndex) ^ seed;
            for (int digitValue = 0; digitValue < base; ++digitValue)
                Perm(digitIndex, digitValue) =
                    PermutationElement(digitValue, base, digitSeed);
        }
    }